

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ErrorsTest::TestErrorsOfFlushMappedNamedBufferRange
          (ErrorsTest *this)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  byte bVar9;
  GLuint not_a_buffer_name;
  GLuint GVar10;
  GLuint buffer;
  GLubyte dummy_data [4];
  GLuint local_3c;
  byte local_37;
  byte local_36;
  byte local_35;
  undefined4 local_34;
  long lVar8;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  local_3c = 0;
  local_34 = 0;
  (**(code **)(lVar8 + 0x3b8))(1);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xd6e);
  (*this->m_pNamedBufferStorage)(local_3c,4,&local_34,0x42);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glNamedBuffeStorage failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xd71);
  GVar10 = 0;
  do {
    GVar10 = GVar10 + 1;
    cVar1 = (**(code **)(lVar8 + 0xc68))(GVar10);
  } while (cVar1 != '\0');
  (*this->m_pFlushMappedNamedBufferRange)(GVar10,0,1);
  bVar2 = ErrorCheckAndLog(this,"glFlushMappedNamedBufferRange",0x502,
                           " if buffer is not the name of an existing buffer object.");
  (*this->m_pMapNamedBufferRange)(local_3c,0,4,0x12);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xd86);
  (*this->m_pFlushMappedNamedBufferRange)(local_3c,-1,1);
  local_35 = ErrorCheckAndLog(this,"glFlushMappedNamedBufferRange",0x501," if offset is negative.");
  (*this->m_pUnmapNamedBuffer)(local_3c);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xd8d);
  (*this->m_pMapNamedBufferRange)(local_3c,0,4,0x12);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xd94);
  (*this->m_pFlushMappedNamedBufferRange)(local_3c,0,-1);
  local_36 = ErrorCheckAndLog(this,"glFlushMappedNamedBufferRange",0x501," if length is negative.");
  (*this->m_pUnmapNamedBuffer)(local_3c);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xd9b);
  (*this->m_pMapNamedBufferRange)(local_3c,0,2,0x12);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xda2);
  (*this->m_pFlushMappedNamedBufferRange)(local_3c,0,4);
  local_37 = ErrorCheckAndLog(this,"glFlushMappedNamedBufferRange",0x501,
                              " if length exceeds the size of the mapping.");
  (*this->m_pUnmapNamedBuffer)(local_3c);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xdaa);
  (*this->m_pMapNamedBufferRange)(local_3c,0,4,0x12);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xdb1);
  (*this->m_pFlushMappedNamedBufferRange)(local_3c,1,4);
  bVar3 = ErrorCheckAndLog(this,"glFlushMappedNamedBufferRange",0x501,
                           " if offset + length exceeds the size of the mapping.");
  (*this->m_pUnmapNamedBuffer)(local_3c);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xdb9);
  (*this->m_pFlushMappedNamedBufferRange)(local_3c,0,4);
  bVar4 = ErrorCheckAndLog(this,"glFlushMappedNamedBufferRange",0x502,
                           " if the buffer object is not mapped.");
  (*this->m_pMapNamedBufferRange)(local_3c,0,4,2);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xdc7);
  (*this->m_pFlushMappedNamedBufferRange)(local_3c,0,4);
  bVar5 = ErrorCheckAndLog(this,"glFlushMappedNamedBufferRange",0x502,
                           " if the buffer is mapped without the MAP_FLUSH_EXPLICIT_BIT flag.");
  (*this->m_pUnmapNamedBuffer)(local_3c);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0xdcf);
  bVar9 = bVar2 & local_35 & local_36 & local_37;
  if (local_3c != 0) {
    (**(code **)(lVar8 + 0x438))(1,&local_3c);
  }
  return (bool)(bVar9 & bVar3 & bVar4 & bVar5);
}

Assistant:

bool ErrorsTest::TestErrorsOfFlushMappedNamedBufferRange()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return value. */
	bool is_ok			= true;
	bool internal_error = false;

	/* Common variables. */
	glw::GLuint  buffer		   = 0;
	glw::GLubyte dummy_data[4] = {};

	try
	{
		/* Common preparations. */
		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		m_pNamedBufferStorage(buffer, sizeof(dummy_data), &dummy_data, GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBuffeStorage failed.");

		/* Test invalid buffer name flush error behavior. */
		{
			/* Prepare for invalid buffer name error behavior verification. */
			glw::GLuint not_a_buffer_name = 0;

			while (gl.isBuffer(++not_a_buffer_name))
				;

			/* Test. */
			m_pFlushMappedNamedBufferRange(not_a_buffer_name, 0, 1);

			is_ok &= ErrorCheckAndLog("glFlushMappedNamedBufferRange", GL_INVALID_OPERATION,
									  " if buffer is not the name of an existing buffer object.");
		}

		/* Test negative offset flush error behavior. */
		{
			(void)(glw::GLbyte*)
				m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data), GL_MAP_WRITE_BIT | GL_MAP_FLUSH_EXPLICIT_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pFlushMappedNamedBufferRange(buffer, -1, 1);

			is_ok &= ErrorCheckAndLog("glFlushMappedNamedBufferRange", GL_INVALID_VALUE, " if offset is negative.");

			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}

		/* Test negative length flush error behavior. */
		{
			(void)(glw::GLbyte*)
				m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data), GL_MAP_WRITE_BIT | GL_MAP_FLUSH_EXPLICIT_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pFlushMappedNamedBufferRange(buffer, 0, -1);

			is_ok &= ErrorCheckAndLog("glFlushMappedNamedBufferRange", GL_INVALID_VALUE, " if length is negative.");

			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}

		/* Test length exceeds the mapping size flush error behavior. */
		{
			(void)(glw::GLbyte*)
				m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data) / 2, GL_MAP_WRITE_BIT | GL_MAP_FLUSH_EXPLICIT_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pFlushMappedNamedBufferRange(buffer, 0, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glFlushMappedNamedBufferRange", GL_INVALID_VALUE,
									  " if length exceeds the size of the mapping.");

			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}

		/* Test offset + length exceeds the mapping size flush error behavior. */
		{
			(void)(glw::GLbyte*)
				m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data), GL_MAP_WRITE_BIT | GL_MAP_FLUSH_EXPLICIT_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pFlushMappedNamedBufferRange(buffer, 1, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glFlushMappedNamedBufferRange", GL_INVALID_VALUE,
									  " if offset + length exceeds the size of the mapping.");

			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}

		/* Test not mapped buffer flush error behavior. */
		{
			m_pFlushMappedNamedBufferRange(buffer, 0, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glFlushMappedNamedBufferRange", GL_INVALID_OPERATION,
									  " if the buffer object is not mapped.");
		}

		/* Test buffer flush without the MAP_FLUSH_EXPLICIT_BIT error behavior. */
		{
			(void)(glw::GLbyte*) m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data), GL_MAP_WRITE_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pFlushMappedNamedBufferRange(buffer, 0, sizeof(dummy_data));

			is_ok &= ErrorCheckAndLog("glFlushMappedNamedBufferRange", GL_INVALID_OPERATION,
									  " if the buffer is mapped without the MAP_FLUSH_EXPLICIT_BIT flag.");

			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}
	}
	catch (...)
	{
		is_ok		   = false;
		internal_error = true;
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = 0;
	}

	if (internal_error)
	{
		throw 0;
	}

	return is_ok;
}